

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O2

void vkt::anon_unknown_0::genUniformBlock
               (ostringstream *out,string *blockName,string *instanceName,int setNdx,int bindingNdx,
               vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *uniforms)

{
  ostream *poVar1;
  VarType *varType_;
  undefined4 in_register_00000084;
  DeclareVariable local_70;
  
  std::operator<<((ostream *)out,"layout(");
  poVar1 = std::operator<<((ostream *)out,"binding = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,setNdx);
  poVar1 = std::operator<<(poVar1,", std140) uniform ");
  poVar1 = std::operator<<(poVar1,(string *)blockName);
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"{\n");
  for (varType_ = *(VarType **)CONCAT44(in_register_00000084,bindingNdx);
      varType_ != (VarType *)((undefined8 *)CONCAT44(in_register_00000084,bindingNdx))[1];
      varType_ = (VarType *)&varType_[3].m_data) {
    poVar1 = std::operator<<((ostream *)out,"\t");
    glu::decl::DeclareVariable::DeclareVariable(&local_70,varType_,(string *)(varType_ + 1),1);
    poVar1 = glu::decl::operator<<(poVar1,&local_70);
    std::operator<<(poVar1,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_70);
  }
  std::operator<<((ostream *)out,"}");
  if (instanceName->_M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)out," ");
    std::operator<<(poVar1,(string *)instanceName);
  }
  std::operator<<((ostream *)out,";\n");
  return;
}

Assistant:

void genUniformBlock (ostringstream& out, const string& blockName, const string& instanceName, int setNdx, int bindingNdx, const vector<Value>& uniforms)
{
	out << "layout(";

	if (setNdx != 0)
		out << "set = " << setNdx << ", ";

	out << "binding = " << bindingNdx << ", std140) uniform " << blockName << "\n"
		<< "{\n";

	for (vector<Value>::const_iterator val = uniforms.begin(); val != uniforms.end(); ++val)
		out << "\t" << glu::declare(val->type, val->name, 1) << ";\n";

	out << "}";

	if (!instanceName.empty())
		out << " " << instanceName;

	out << ";\n";
}